

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

void __thiscall EntryKey::dump(EntryKey *this)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xffffffb5 | 8;
  poVar1 = std::operator<<((ostream *)&std::cout,"Flags: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Name index: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Ext index: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Link index: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Is directory: ");
  pcVar3 = "true";
  pcVar2 = "true";
  if ((this->m_flags & 1) == 0) {
    pcVar2 = "false";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Is file: ");
  if ((this->m_flags & 2) == 0) {
    pcVar3 = "false";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void EntryKey::dump() const
{
	std::cout
		<< std::hex
		<< "Flags: 0x" << flags() << std::endl
		<< "Name index: 0x" << nameIndex() << std::endl
		<< "Ext index: 0x" << extIndex() << std::endl
		<< "Link index: 0x" << linkIndex() << std::endl
		<< "Is directory: " << (isDirectory() ? "true" : "false") << std::endl
		<< "Is file: " << (isFile() ? "true" : "false") << std::endl
		<< std::dec << std::endl;
}